

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
operator()(LineSegmentsRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  ImU32 IVar7;
  GetterYs<long_long> *pGVar8;
  GetterYRef *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  double dVar13;
  ImPlotContext *gp;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar5 = pGVar8->Count;
  iVar6 = this->Transformer->YAxis;
  dVar13 = (double)GImPlot->PixelRange[iVar6].Min.x;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar21 = (float)(((pGVar8->XScale * (double)prim + pGVar8->X0) - dVar2) * GImPlot->Mx + dVar13);
  dVar12 = (double)GImPlot->PixelRange[iVar6].Min.y;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar6].Range.Min;
  fVar17 = (float)(((double)*(long *)((long)pGVar8->Ys +
                                     (long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) *
                                     (long)pGVar8->Stride) - dVar3) * GImPlot->My[iVar6] + dVar12);
  fVar16 = (float)((((double)prim * pGVar9->XScale + pGVar9->X0) - dVar2) * GImPlot->Mx + dVar13);
  fVar18 = (float)((pGVar9->YRef - dVar3) * GImPlot->My[iVar6] + dVar12);
  fVar20 = fVar17;
  if (fVar18 <= fVar17) {
    fVar20 = fVar18;
  }
  bVar14 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar18 <= fVar17) & (uint)fVar18 |
                      -(uint)(fVar18 <= fVar17) & (uint)fVar17), pfVar1 = &(cull_rect->Min).y,
     bVar14 = false, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar21;
    if (fVar16 <= fVar21) {
      fVar20 = fVar16;
    }
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar16 <= fVar21) & (uint)fVar16 |
                      -(uint)(fVar16 <= fVar21) & (uint)fVar21);
      bVar14 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar14 != false) {
    fVar20 = this->Weight;
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar19 = fVar16 - fVar21;
    fVar22 = fVar18 - fVar17;
    fVar15 = fVar19 * fVar19 + fVar22 * fVar22;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar19 = fVar19 * (1.0 / fVar15);
      fVar22 = fVar22 * (1.0 / fVar15);
    }
    fVar20 = fVar20 * 0.5;
    fVar19 = fVar19 * fVar20;
    fVar20 = fVar20 * fVar22;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar20 + fVar21;
    (pIVar10->pos).y = fVar17 - fVar19;
    pIVar10->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar7;
    pIVar10[1].pos.x = fVar20 + fVar16;
    pIVar10[1].pos.y = fVar18 - fVar19;
    pIVar10[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar7;
    pIVar10[2].pos.x = fVar16 - fVar20;
    pIVar10[2].pos.y = fVar19 + fVar18;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar7;
    pIVar10[3].pos.x = fVar21 - fVar20;
    pIVar10[3].pos.y = fVar19 + fVar17;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }